

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O3

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
::_positive_vine_swap
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  long lVar4;
  ulong uVar5;
  Column_dimension_option CVar6;
  bool bVar7;
  Pos_index PVar8;
  Pos_index PVar9;
  ulong uVar10;
  ID_index IVar11;
  ID_index pivot;
  uint uVar12;
  ID_index IVar13;
  long lVar14;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *pIVar15;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *pIVar16;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *pIVar17;
  anon_class_1_0_00000001 local_58;
  anon_class_1_0_00000001 local_57;
  anon_class_1_0_00000001 local_56;
  anon_class_1_0_00000001 local_55;
  Index local_54;
  anon_class_8_1_e4bd5e45 local_50;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *local_48;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *local_40;
  Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *local_38;
  
  uVar10 = (ulong)columnIndex1;
  puVar3 = (this->super_type).pivotToPosition_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)this[1].super_type.
                super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                .barcode_.
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  lVar14 = uVar10 * 0x30;
  pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
             *)(lVar4 + lVar14);
  uVar5 = (ulong)columnIndex2;
  pIVar17 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
             *)(lVar4 + uVar5 * 0x30);
  uVar12 = *(uint *)(lVar4 + 4 + lVar14);
  uVar1 = *(uint *)(lVar4 + 4 + uVar5 * 0x30);
  uVar2 = puVar3[uVar12];
  puVar3[uVar12] = puVar3[uVar1];
  puVar3[uVar1] = uVar2;
  local_54 = columnIndex2;
  if (*(int *)(lVar4 + 8 + lVar14) == -1) {
    PVar8 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
            ::birth(&this->super_type,(pIVar17->super_Chain_column_option).pivot_);
    local_48 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                *)CONCAT44(local_48._4_4_,PVar8);
    local_40 = pIVar15;
    PVar8 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
            ::birth(&this->super_type,(pIVar15->super_Chain_column_option).pivot_);
    puVar3 = (pointer)this[1].super_type.
                      super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                      .barcode_.
                      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    if ((PVar8 <= (uint)local_48) ||
       ((pIVar17->super_Chain_column_option).pairedColumn_ != 0xffffffff)) {
      uVar12 = puVar3[uVar10 * 0xc + 1];
      goto LAB_00166c02;
    }
    pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               *)(puVar3 + uVar5 * 0xc);
    uVar12 = puVar3[uVar5 * 0xc + 1];
    pIVar16 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               *)(puVar3 + uVar10 * 0xc);
    local_54 = columnIndex1;
    local_50.targetColumn = pIVar15;
    bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                      (pIVar16,pIVar15,&local_56,&local_50,&local_57,&local_58,&local_55);
    if (bVar7) {
      CVar6.dim_ = (pIVar15->super_Column_dimension_option).dim_;
      IVar11 = (pIVar15->super_Chain_column_option).pivot_;
      IVar13 = (pIVar16->super_Chain_column_option).pivot_;
      pIVar15->super_Column_dimension_option =
           (Column_dimension_option)(pIVar16->super_Column_dimension_option).dim_;
      (pIVar15->super_Chain_column_option).pivot_ = IVar13;
      pIVar16->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
      (pIVar16->super_Chain_column_option).pivot_ = IVar11;
    }
    uVar1 = (pIVar15->super_Chain_column_option).pivot_;
    if (uVar12 != uVar1) {
      puVar3 = this[1].super_type.
               super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = puVar3[uVar12];
      puVar3[uVar12] = puVar3[uVar1];
      puVar3[uVar1] = uVar2;
    }
    IVar13 = (local_40->super_Chain_column_option).pivot_;
    IVar11 = (pIVar17->super_Chain_column_option).pivot_;
  }
  else {
    uVar12 = (pIVar17->super_Chain_column_option).pivot_;
    if ((pIVar17->super_Chain_column_option).pairedColumn_ == 0xffffffff) {
      local_50.targetColumn = pIVar17;
      bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                        (pIVar15,pIVar17,&local_56,&local_50,&local_57,&local_58,&local_55);
      if (bVar7) {
        CVar6.dim_ = (pIVar17->super_Column_dimension_option).dim_;
        IVar11 = (pIVar17->super_Chain_column_option).pivot_;
        IVar13 = (pIVar15->super_Chain_column_option).pivot_;
        pIVar17->super_Column_dimension_option =
             (Column_dimension_option)(pIVar15->super_Column_dimension_option).dim_;
        (pIVar17->super_Chain_column_option).pivot_ = IVar13;
        pIVar15->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
        (pIVar15->super_Chain_column_option).pivot_ = IVar11;
      }
      uVar1 = (pIVar17->super_Chain_column_option).pivot_;
      if (uVar12 != uVar1) {
        puVar3 = this[1].super_type.
                 super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                 .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar2 = puVar3[uVar12];
        puVar3[uVar12] = puVar3[uVar1];
        puVar3[uVar1] = uVar2;
        uVar12 = (pIVar17->super_Chain_column_option).pivot_;
      }
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
      ::positive_transpose(&this->super_type,(pIVar15->super_Chain_column_option).pivot_,uVar12);
      return columnIndex1;
    }
    local_48 = pIVar17;
    PVar8 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
            ::death(&this->super_type,uVar12);
    PVar9 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
            ::death(&this->super_type,(pIVar15->super_Chain_column_option).pivot_);
    lVar4 = (long)this[1].super_type.
                  super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                  .barcode_.
                  super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_38 = this;
    if (PVar9 <= PVar8) {
      lVar14 = (ulong)(pIVar15->super_Chain_column_option).pairedColumn_ * 0x30;
      pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                 *)(lVar4 + lVar14);
      uVar12 = *(uint *)(lVar4 + 4 + lVar14);
      pIVar17 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                 *)((ulong)(local_48->super_Chain_column_option).pairedColumn_ * 0x30 + lVar4);
      local_50.targetColumn = pIVar15;
      bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                        (pIVar17,pIVar15,&local_56,&local_50,&local_57,&local_58,&local_55);
      if (bVar7) {
        CVar6.dim_ = (pIVar15->super_Column_dimension_option).dim_;
        IVar11 = (pIVar15->super_Chain_column_option).pivot_;
        IVar13 = (pIVar17->super_Chain_column_option).pivot_;
        pIVar15->super_Column_dimension_option =
             (Column_dimension_option)(pIVar17->super_Column_dimension_option).dim_;
        (pIVar15->super_Chain_column_option).pivot_ = IVar13;
        pIVar17->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
        (pIVar17->super_Chain_column_option).pivot_ = IVar11;
      }
      uVar1 = (pIVar15->super_Chain_column_option).pivot_;
      if (uVar12 != uVar1) {
        puVar3 = local_38[1].super_type.
                 super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                 .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar2 = puVar3[uVar12];
        puVar3[uVar12] = puVar3[uVar1];
        puVar3[uVar1] = uVar2;
      }
      puVar3 = (pointer)local_38[1].super_type.
                        super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                        .barcode_.
                        super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = puVar3[uVar10 * 0xc + 1];
      this = local_38;
LAB_00166c02:
      pIVar17 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                 *)(puVar3 + uVar10 * 0xc);
      pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                 *)(puVar3 + uVar5 * 0xc);
      local_50.targetColumn = pIVar17;
      bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                        (pIVar15,pIVar17,&local_56,&local_50,&local_57,&local_58,&local_55);
      if (bVar7) {
        CVar6.dim_ = (pIVar17->super_Column_dimension_option).dim_;
        IVar11 = (pIVar17->super_Chain_column_option).pivot_;
        IVar13 = (pIVar15->super_Chain_column_option).pivot_;
        pIVar17->super_Column_dimension_option =
             (Column_dimension_option)(pIVar15->super_Column_dimension_option).dim_;
        (pIVar17->super_Chain_column_option).pivot_ = IVar13;
        pIVar15->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
        (pIVar15->super_Chain_column_option).pivot_ = IVar11;
      }
      uVar1 = (pIVar17->super_Chain_column_option).pivot_;
      if (uVar12 == uVar1) {
        return local_54;
      }
      puVar3 = this[1].super_type.
               super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = puVar3[uVar12];
      puVar3[uVar12] = puVar3[uVar1];
      puVar3[uVar1] = uVar2;
      return local_54;
    }
    lVar14 = (ulong)(local_48->super_Chain_column_option).pairedColumn_ * 0x30;
    pIVar17 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               *)(lVar4 + lVar14);
    uVar12 = *(uint *)(lVar4 + 4 + lVar14);
    pIVar16 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               *)((ulong)(pIVar15->super_Chain_column_option).pairedColumn_ * 0x30 + lVar4);
    local_54 = columnIndex1;
    local_50.targetColumn = pIVar17;
    local_40 = pIVar15;
    bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                      (pIVar16,pIVar17,&local_56,&local_50,&local_57,&local_58,&local_55);
    this = local_38;
    if (bVar7) {
      CVar6.dim_ = (pIVar17->super_Column_dimension_option).dim_;
      IVar11 = (pIVar17->super_Chain_column_option).pivot_;
      IVar13 = (pIVar16->super_Chain_column_option).pivot_;
      pIVar17->super_Column_dimension_option =
           (Column_dimension_option)(pIVar16->super_Column_dimension_option).dim_;
      (pIVar17->super_Chain_column_option).pivot_ = IVar13;
      pIVar16->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
      (pIVar16->super_Chain_column_option).pivot_ = IVar11;
    }
    uVar1 = (pIVar17->super_Chain_column_option).pivot_;
    if (uVar12 != uVar1) {
      puVar3 = local_38[1].super_type.
               super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = puVar3[uVar12];
      puVar3[uVar12] = puVar3[uVar1];
      puVar3[uVar1] = uVar2;
    }
    puVar3 = (pointer)local_38[1].super_type.
                      super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                      .barcode_.
                      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               *)(puVar3 + uVar5 * 0xc);
    uVar12 = puVar3[uVar5 * 0xc + 1];
    pIVar17 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               *)(puVar3 + uVar10 * 0xc);
    local_50.targetColumn = pIVar15;
    bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                      (pIVar17,pIVar15,&local_56,&local_50,&local_57,&local_58,&local_55);
    if (bVar7) {
      CVar6.dim_ = (pIVar15->super_Column_dimension_option).dim_;
      IVar11 = (pIVar15->super_Chain_column_option).pivot_;
      IVar13 = (pIVar17->super_Chain_column_option).pivot_;
      pIVar15->super_Column_dimension_option =
           (Column_dimension_option)(pIVar17->super_Column_dimension_option).dim_;
      (pIVar15->super_Chain_column_option).pivot_ = IVar13;
      pIVar17->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
      (pIVar17->super_Chain_column_option).pivot_ = IVar11;
    }
    uVar1 = (pIVar15->super_Chain_column_option).pivot_;
    if (uVar12 != uVar1) {
      puVar3 = this[1].super_type.
               super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = puVar3[uVar12];
      puVar3[uVar12] = puVar3[uVar1];
      puVar3[uVar1] = uVar2;
    }
    IVar13 = (local_40->super_Chain_column_option).pivot_;
    IVar11 = (local_48->super_Chain_column_option).pivot_;
  }
  Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  ::positive_transpose(&this->super_type,IVar13,IVar11);
  return local_54;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::_positive_vine_swap(
    Index columnIndex1, Index columnIndex2)
{
  auto& col1 = _matrix()->get_column(columnIndex1);
  auto& col2 = _matrix()->get_column(columnIndex2);

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    CP::swap_positions(col1.get_pivot(), col2.get_pivot());
  }
  // TODO: factorize the cases
  // But for debug it is much more easier to understand what is happening when split like this
  if (!col1.is_paired()) {  // F x *
    bool hasSmallerBirth;
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      // this order because position were swapped with CP::swap_positions
      hasSmallerBirth = (CP::birth(col2.get_pivot()) < CP::birth(col1.get_pivot()));
    } else {
      hasSmallerBirth = birthComp_(columnIndex1, columnIndex2);
    }

    if (!col2.is_paired() && hasSmallerBirth) {
      _matrix()->add_to(columnIndex1, columnIndex2);
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
      }
      return columnIndex1;
    }
    _matrix()->add_to(columnIndex2, columnIndex1);

    return columnIndex2;
  }

  if (!col2.is_paired()) {  // G x F
    static_cast<Master_chain_matrix*>(this)->add_to(columnIndex1, columnIndex2);
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
    }
    return columnIndex1;
  }

  bool hasSmallerDeath;
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    // this order because position were swapped with CP::swap_positions
    hasSmallerDeath = (CP::death(col2.get_pivot()) < CP::death(col1.get_pivot()));
  } else {
    hasSmallerDeath = deathComp_(columnIndex1, columnIndex2);
  }

  // G x G
  if (hasSmallerDeath)
  {
    _matrix()->add_to(col1.get_paired_chain_index(), col2.get_paired_chain_index());
    _matrix()->add_to(columnIndex1, columnIndex2);
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
    }
    return columnIndex1;
  }

  _matrix()->add_to(col2.get_paired_chain_index(), col1.get_paired_chain_index());
  _matrix()->add_to(columnIndex2, columnIndex1);

  return columnIndex2;
}